

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
          IConfig *config)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  Filter *extraout_RDX;
  Filter *extraout_RDX_00;
  Filter *extraout_RDX_01;
  Filter *extraout_RDX_02;
  Filter *extraout_RDX_03;
  Filter *extraout_RDX_04;
  Filter *extraout_RDX_05;
  Filter *extraout_RDX_06;
  Filter *filter;
  TestCaseHandle *test;
  pointer pTVar4;
  TestSpec *this_00;
  vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
  currentMatches;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range2;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  TestSpec *local_78;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_70;
  FilterMatch local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = testCases;
  std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_filters).
                    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_filters).
                    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  this_00 = (TestSpec *)
            (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_78 = (TestSpec *)
             (this->m_filters).
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_78) {
    filter = extraout_RDX;
    do {
      local_98 = (void *)0x0;
      uStack_90 = 0;
      local_88 = 0;
      pTVar1 = (local_70->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar4 = (local_70->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1;
          pTVar4 = pTVar4 + 1) {
        if ((pTVar4->m_info->properties & Throws) == None) {
LAB_0014eed8:
          bVar2 = Filter::matches((Filter *)this_00,pTVar4->m_info);
          filter = extraout_RDX_01;
          if (bVar2) {
            local_68.name._M_dataplus._M_p = (pointer)pTVar4;
            std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>::
            emplace_back<Catch::TestCaseHandle_const*>
                      ((vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>
                        *)&local_98,(TestCaseHandle **)&local_68);
            filter = extraout_RDX_02;
          }
        }
        else {
          iVar3 = (*config->_vptr_IConfig[2])(config);
          filter = extraout_RDX_00;
          if ((char)iVar3 != '\0') goto LAB_0014eed8;
        }
      }
      extractFilterName_abi_cxx11_(&local_68.name,this_00,filter);
      std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>::
      vector(&local_68.tests,
             (vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)&local_98);
      std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
      emplace_back<Catch::TestSpec::FilterMatch>(__return_storage_ptr__,&local_68);
      filter = extraout_RDX_03;
      if (local_68.tests.
          super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.tests.
                        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.tests.
                              super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.tests.
                              super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        filter = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
        operator_delete(local_68.name._M_dataplus._M_p,
                        local_68.name.field_2._M_allocated_capacity + 1);
        filter = extraout_RDX_05;
      }
      if (local_98 != (void *)0x0) {
        operator_delete(local_98,local_88 - (long)local_98);
        filter = extraout_RDX_06;
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCaseHandle> const& testCases, IConfig const& config ) const {
        Matches matches;
        matches.reserve( m_filters.size() );
        for ( auto const& filter : m_filters ) {
            std::vector<TestCaseHandle const*> currentMatches;
            for ( auto const& test : testCases )
                if ( isThrowSafe( test, config ) &&
                     filter.matches( test.getTestCaseInfo() ) )
                    currentMatches.emplace_back( &test );
            matches.push_back(
                FilterMatch{ extractFilterName( filter ), currentMatches } );
        }
        return matches;
    }